

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrecisionTuner.cpp
# Opt level: O2

double __thiscall
PrecisionTuner::__overloading_function
          (PrecisionTuner *this,vector<void_*,_std::allocator<void_*>_> *btVec,string *s,float fres,
          double dres,double value,string *label,double timeStamp)

{
  Profile *pPVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  double dVar5;
  double local_f8;
  string local_a0;
  string local_80;
  ShadowValue shadowValue;
  
  if (DebugFlag) {
    bVar2 = isCurrentDebugType("info");
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"STARTING ");
      poVar4 = std::operator<<(poVar4,"__overloading_function");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (this->__mode == APPLYING_PROF) {
    ShadowValue::ShadowValue(&shadowValue,(double)fres,(float)dres,value,false,timeStamp);
    pPVar1 = this->__profile;
    std::__cxx11::string::string((string *)&local_a0,(string *)label);
    Profile::applyProfiling(pPVar1,btVec,&local_a0,&shadowValue);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar2 = false;
  }
  else {
    if (this->__mode != APPLYING_STRAT) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"PrecisionTuner ERROR: no __mode chosen");
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(-1);
    }
    pPVar1 = this->__profile;
    std::__cxx11::string::string((string *)&local_80,(string *)label);
    bVar2 = Profile::applyStrategy(pPVar1,btVec,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  local_f8 = (double)fres;
  if (DebugFlag == true) {
    bVar3 = isCurrentDebugType("fperror");
    if (bVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"SINGLE precision? ");
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (DebugFlag == true) {
    bVar3 = isCurrentDebugType("fperrorplus");
    if (bVar3) {
      *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 0x10;
      if (bVar2 == false) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)s);
        std::operator<<(poVar4," dres=");
        dVar5 = dres;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)s);
        std::operator<<(poVar4," dres=");
        poVar4 = std::ostream::_M_insert<double>(dres);
        poVar4 = std::operator<<(poVar4," fres=");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,fres);
        std::operator<<(poVar4," AbsError: ");
        poVar4 = std::ostream::_M_insert<double>(ABS(local_f8 - dres));
        std::operator<<(poVar4," RelError: ");
        dVar5 = ABS((local_f8 - dres) / dres);
      }
      poVar4 = std::ostream::_M_insert<double>(dVar5);
      std::operator<<(poVar4," value=");
      poVar4 = std::ostream::_M_insert<double>(value);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (DebugFlag == true) {
    bVar3 = isCurrentDebugType("fperror");
    if (bVar3) {
      *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 0x10;
      if (bVar2 == false) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)s);
        poVar4 = std::operator<<(poVar4," in double precision.");
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)s);
        std::operator<<(poVar4," RelError: ");
        poVar4 = std::ostream::_M_insert<double>(ABS((local_f8 - dres) / dres));
      }
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (DebugFlag == true) {
    bVar3 = isCurrentDebugType("info");
    if (bVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"ENDING ");
      poVar4 = std::operator<<(poVar4,"__overloading_function");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (bVar2 == false) {
    local_f8 = dres;
  }
  return local_f8;
}

Assistant:

double PrecisionTuner::__overloading_function(vector<void*> &btVec, string s,
        float fres, double dres, double value, string label, double timeStamp){
    bool singlePrecision, singlePrecisionProfiling;
    double res;
#ifdef NDEBUG
    UNUSED(s);
    UNUSED(value);
#endif
    DEBUG("info",cerr << "STARTING " << __FUNCTION__ << endl;);
    singlePrecisionProfiling = false;
    singlePrecision = false;
    switch(__mode){
        case APPLYING_STRAT:
            singlePrecision = __profile->applyStrategy(btVec, label);
            break;
        case APPLYING_PROF:
            {
                ShadowValue shadowValue(fres, dres, value, singlePrecisionProfiling, timeStamp);
                __profile->applyProfiling(btVec, label, shadowValue);
            }
            break;
        default:
            {
                cerr << "PrecisionTuner ERROR: no __mode chosen" << endl;
                exit(-1);
            }
            break;
    }
    res = singlePrecision ? (double) fres : dres;
    DEBUG("fperror", cerr << "SINGLE precision? " << singlePrecision << endl; );
    DEBUG("fperrorplus", cerr << std::setprecision(16) ; double relErr = fabs(fres - dres) / fabs(dres); if(singlePrecision)  cerr << s << " dres=" << dres << " fres=" << fres << " AbsError: " << fabs(fres - dres)<<" RelError: " << relErr << " value=" << value <<endl; else cerr << s << " dres=" << dres<< " value=" << value << endl;);
    DEBUG("fperror", cerr << std::setprecision(16) ; double relErr = fabs(fres - dres) / fabs(dres); if(singlePrecision)  cerr << s << " RelError: " << relErr  <<endl; else cerr << s << " in double precision." << endl;);
    DEBUG("info",cerr << "ENDING " << __FUNCTION__ << endl;);
    return res;
}